

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreaction.cc
# Opt level: O0

bool ActionMarkImplied::isPossibleAlias(Varnode *vn1,Varnode *vn2,int4 depth)

{
  bool bVar1;
  int depth_00;
  uintb uVar2;
  uintb uVar3;
  PcodeOp *this;
  PcodeOp *this_00;
  Varnode *pVVar4;
  Varnode *pVVar5;
  uintb val2;
  uintb val1;
  int4 mult2;
  int4 mult1;
  OpCode opc2;
  OpCode opc1;
  PcodeOp *op2;
  PcodeOp *op1;
  Varnode *cvn2;
  Varnode *cvn1;
  int4 depth_local;
  Varnode *vn2_local;
  Varnode *vn1_local;
  
  if (vn1 == vn2) {
    return true;
  }
  bVar1 = Varnode::isWritten(vn1);
  if ((!bVar1) || (bVar1 = Varnode::isWritten(vn2), !bVar1)) {
    bVar1 = Varnode::isConstant(vn1);
    if ((bVar1) && (bVar1 = Varnode::isConstant(vn2), bVar1)) {
      uVar2 = Varnode::getOffset(vn1);
      uVar3 = Varnode::getOffset(vn2);
      return uVar2 == uVar3;
    }
    bVar1 = isPossibleAliasStep(vn1,vn2);
    return bVar1;
  }
  bVar1 = isPossibleAliasStep(vn1,vn2);
  if (!bVar1) {
    return false;
  }
  this = Varnode::getDef(vn1);
  this_00 = Varnode::getDef(vn2);
  mult1 = PcodeOp::code(this);
  mult2 = PcodeOp::code(this_00);
  val1._4_4_ = 1;
  val1._0_4_ = 1;
  if (mult1 == CPUI_PTRSUB) {
    mult1 = 0x13;
  }
  else if (mult1 == CPUI_PTRADD) {
    mult1 = 0x13;
    pVVar4 = PcodeOp::getIn(this,2);
    uVar2 = Varnode::getOffset(pVVar4);
    val1._4_4_ = (int)uVar2;
  }
  if (mult2 == CPUI_PTRSUB) {
    mult2 = 0x13;
  }
  else if (mult2 == CPUI_PTRADD) {
    mult2 = 0x13;
    pVVar4 = PcodeOp::getIn(this_00,2);
    uVar2 = Varnode::getOffset(pVVar4);
    val1._0_4_ = (int)uVar2;
  }
  if (mult1 != mult2) {
    return true;
  }
  if (depth == 0) {
    return true;
  }
  depth_00 = depth + -1;
  if ((mult1 == 1) || (mult1 - 0x11U < 2)) {
LAB_0066090c:
    pVVar4 = PcodeOp::getIn(this,0);
    pVVar5 = PcodeOp::getIn(this_00,0);
    vn1_local._7_1_ = isPossibleAlias(pVVar4,pVVar5,depth_00);
  }
  else {
    if (mult1 == 0x13) {
      pVVar4 = PcodeOp::getIn(this,1);
      pVVar5 = PcodeOp::getIn(this_00,1);
      bVar1 = Varnode::isConstant(pVVar4);
      if ((bVar1) && (bVar1 = Varnode::isConstant(pVVar5), bVar1)) {
        uVar2 = Varnode::getOffset(pVVar4);
        uVar3 = Varnode::getOffset(pVVar5);
        if ((long)val1._4_4_ * uVar2 == (long)(int)val1 * uVar3) {
          pVVar4 = PcodeOp::getIn(this,0);
          pVVar5 = PcodeOp::getIn(this_00,0);
          bVar1 = isPossibleAlias(pVVar4,pVVar5,depth_00);
          return bVar1;
        }
        pVVar4 = PcodeOp::getIn(this,0);
        pVVar5 = PcodeOp::getIn(this_00,0);
        bVar1 = functionalEquality(pVVar4,pVVar5);
        return (bool)((bVar1 ^ 0xffU) & 1);
      }
      if (val1._4_4_ != (int)val1) {
        return true;
      }
      pVVar4 = PcodeOp::getIn(this,0);
      pVVar5 = PcodeOp::getIn(this_00,0);
      bVar1 = functionalEquality(pVVar4,pVVar5);
      if (bVar1) {
        pVVar4 = PcodeOp::getIn(this,1);
        pVVar5 = PcodeOp::getIn(this_00,1);
        bVar1 = isPossibleAlias(pVVar4,pVVar5,depth_00);
        return bVar1;
      }
      pVVar4 = PcodeOp::getIn(this,1);
      pVVar5 = PcodeOp::getIn(this_00,1);
      bVar1 = functionalEquality(pVVar4,pVVar5);
      if (bVar1) {
        pVVar4 = PcodeOp::getIn(this,0);
        pVVar5 = PcodeOp::getIn(this_00,0);
        bVar1 = isPossibleAlias(pVVar4,pVVar5,depth_00);
        return bVar1;
      }
      pVVar4 = PcodeOp::getIn(this,0);
      pVVar5 = PcodeOp::getIn(this_00,1);
      bVar1 = functionalEquality(pVVar4,pVVar5);
      if (bVar1) {
        pVVar4 = PcodeOp::getIn(this,1);
        pVVar5 = PcodeOp::getIn(this_00,0);
        bVar1 = isPossibleAlias(pVVar4,pVVar5,depth_00);
        return bVar1;
      }
      pVVar4 = PcodeOp::getIn(this,1);
      pVVar5 = PcodeOp::getIn(this_00,0);
      bVar1 = functionalEquality(pVVar4,pVVar5);
      if (bVar1) {
        pVVar4 = PcodeOp::getIn(this,0);
        pVVar5 = PcodeOp::getIn(this_00,1);
        bVar1 = isPossibleAlias(pVVar4,pVVar5,depth_00);
        return bVar1;
      }
    }
    else if (mult1 == 0x18 || mult1 == 0x19) goto LAB_0066090c;
    vn1_local._7_1_ = true;
  }
  return vn1_local._7_1_;
}

Assistant:

bool ActionMarkImplied::isPossibleAlias(Varnode *vn1,Varnode *vn2,int4 depth)

{
  if (vn1 == vn2) return true;	// Definite alias
  if ((!vn1->isWritten())||(!vn2->isWritten())) {
    if (vn1->isConstant() && vn2->isConstant())
      return (vn1->getOffset()==vn2->getOffset()); // FIXME: these could be NEAR each other and still have an alias
    return isPossibleAliasStep(vn1,vn2);
  }

  if (!isPossibleAliasStep(vn1,vn2))
    return false;
  Varnode *cvn1,*cvn2;
  PcodeOp *op1 = vn1->getDef();
  PcodeOp *op2 = vn2->getDef();
  OpCode opc1 = op1->code();
  OpCode opc2 = op2->code();
  int4 mult1 = 1;
  int4 mult2 = 1;
  if (opc1 == CPUI_PTRSUB)
    opc1 = CPUI_INT_ADD;
  else if (opc1 == CPUI_PTRADD) {
    opc1 = CPUI_INT_ADD;
    mult1 = (int4) op1->getIn(2)->getOffset();
  }
  if (opc2 == CPUI_PTRSUB)
    opc2 = CPUI_INT_ADD;
  else if (opc2 == CPUI_PTRADD) {
    opc2 = CPUI_INT_ADD;
    mult2 = (int4) op2->getIn(2)->getOffset();
  }
  if (opc1 != opc2) return true;
  if (depth == 0) return true;	// Couldn't find absolute difference
  depth -= 1;
  switch(opc1) {
  case CPUI_COPY:
  case CPUI_INT_ZEXT:
  case CPUI_INT_SEXT:
  case CPUI_INT_2COMP:
  case CPUI_INT_NEGATE:
    return isPossibleAlias(op1->getIn(0),op2->getIn(0),depth);
  case CPUI_INT_ADD:
    cvn1 = op1->getIn(1);
    cvn2 = op2->getIn(1);
    if (cvn1->isConstant() && cvn2->isConstant()) {
      uintb val1 = mult1 * cvn1->getOffset();
      uintb val2 = mult2 * cvn2->getOffset();
      if (val1 == val2)
	return isPossibleAlias(op1->getIn(0),op2->getIn(0),depth);
      return !functionalEquality(op1->getIn(0),op2->getIn(0));
    }
    if (mult1 != mult2) return true;
    if (functionalEquality(op1->getIn(0),op2->getIn(0)))
      return isPossibleAlias(op1->getIn(1),op2->getIn(1),depth);
    if (functionalEquality(op1->getIn(1),op2->getIn(1)))
      return isPossibleAlias(op1->getIn(0),op2->getIn(0),depth);
    if (functionalEquality(op1->getIn(0),op2->getIn(1)))
      return isPossibleAlias(op1->getIn(1),op2->getIn(0),depth);
    if (functionalEquality(op1->getIn(1),op2->getIn(0)))
      return isPossibleAlias(op1->getIn(0),op2->getIn(1),depth);
    break;
  default:
    break;
  }
  return true;
}